

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O2

int ddSymmSiftingAux(DdManager *table,int x,int xLow,int xHigh)

{
  DdSubtable *pDVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  DdNode *pDVar7;
  DdNode *moves;
  DdNode *pDVar8;
  DdHalfWord y;
  DdHalfWord DVar9;
  uint uVar10;
  uint uVar11;
  DdNode *pDVar12;
  
  iVar3 = table->keys - table->isolated;
  uVar11 = x;
  if (xHigh - x < x - xLow) {
    while (xLow < (int)uVar11) {
      iVar5 = uVar11 - 1;
      iVar4 = cuddSymmCheck(table,iVar5,uVar11);
      if (iVar4 == 0) break;
      pDVar1 = table->subtables;
      uVar6 = pDVar1[iVar5].next;
      pDVar1[iVar5].next = uVar11;
      pDVar1[x].next = uVar6;
      uVar11 = uVar6;
    }
  }
  else {
    while ((int)uVar11 < xHigh) {
      uVar6 = uVar11 + 1;
      iVar5 = cuddSymmCheck(table,uVar11,uVar6);
      if (iVar5 == 0) break;
      pDVar1 = table->subtables;
      uVar10 = uVar6;
      do {
        uVar2 = uVar10;
        uVar10 = pDVar1[(int)uVar2].next;
      } while (uVar2 < pDVar1[(int)uVar2].next);
      pDVar1[(int)uVar2].next = pDVar1[(int)uVar11].next;
      pDVar1[(int)uVar11].next = uVar6;
      uVar11 = uVar2;
    }
  }
  do {
    uVar11 = x;
    x = table->subtables[(int)uVar11].next;
  } while (uVar11 < (uint)x);
  if (uVar11 == xLow) {
    if (xLow == xHigh) {
      return 1;
    }
    pDVar7 = (DdNode *)ddSymmSiftingDown(table,xLow,xHigh);
    if (pDVar7 == (DdNode *)0x0) {
      return 1;
    }
    if (pDVar7 == (DdNode *)0x1) {
      return 0;
    }
    y = pDVar7->ref;
    uVar11 = y;
    do {
      uVar6 = uVar11;
      uVar11 = table->subtables[(int)uVar6].next;
    } while (uVar6 < uVar11);
    if (uVar6 != y) {
LAB_007504d2:
      iVar3 = table->keys - table->isolated;
      pDVar8 = (DdNode *)ddSymmSiftingUp(table,y,xLow);
      moves = pDVar8;
      goto LAB_00750510;
    }
    iVar3 = ddSymmSiftingBackward(table,(Move *)pDVar7,iVar3);
    moves = (DdNode *)0x0;
LAB_00750515:
    if (iVar3 != 0) {
      while (pDVar7 != (DdNode *)0x0) {
        pDVar8 = (pDVar7->type).kids.T;
        pDVar7->ref = 0;
        pDVar7->next = table->nextFree;
        table->nextFree = pDVar7;
        pDVar7 = pDVar8;
      }
      while (moves != (DdNode *)0x0) {
        pDVar7 = (moves->type).kids.T;
        moves->ref = 0;
        moves->next = table->nextFree;
        table->nextFree = moves;
        moves = pDVar7;
      }
      return 1;
    }
  }
  else {
    iVar5 = cuddNextHigh(table,uVar11);
    if (xHigh < iVar5) {
      uVar6 = table->subtables[(int)uVar11].next;
      if (uVar6 == xLow) {
        return 1;
      }
      moves = (DdNode *)ddSymmSiftingUp(table,uVar6,xLow);
      if (moves == (DdNode *)0x0) {
        return 1;
      }
      if (moves == (DdNode *)0x1) {
        return 0;
      }
      DVar9 = moves->index;
      if (uVar11 - uVar6 == DVar9 - table->subtables[(int)DVar9].next) {
        iVar3 = ddSymmSiftingBackward(table,(Move *)moves,iVar3);
        pDVar7 = (DdNode *)0x0;
        goto LAB_00750515;
      }
      iVar3 = table->keys - table->isolated;
LAB_007504fd:
      pDVar8 = (DdNode *)ddSymmSiftingDown(table,DVar9,xHigh);
      pDVar7 = pDVar8;
LAB_00750510:
      iVar3 = ddSymmSiftingBackward(table,(Move *)pDVar8,iVar3);
      goto LAB_00750515;
    }
    if ((int)(uVar11 - xLow) <= (int)(xHigh - uVar11)) {
      uVar11 = table->subtables[(int)uVar11].next;
      moves = (DdNode *)ddSymmSiftingUp(table,uVar11,xLow);
      if (moves == (DdNode *)0x1) {
        return 0;
      }
      if (moves == (DdNode *)0x0) {
        do {
          DVar9 = uVar11;
          uVar11 = table->subtables[(int)DVar9].next;
        } while (DVar9 < uVar11);
      }
      else {
        DVar9 = moves->index;
        uVar11 = table->subtables[(int)DVar9].next;
      }
      pDVar8 = (DdNode *)ddSymmSiftingDown(table,DVar9,xHigh);
      if (pDVar8 == (DdNode *)0x0) {
        y = table->subtables[(int)DVar9].next;
        uVar6 = DVar9;
      }
      else {
        if (pDVar8 == (DdNode *)0x1) goto LAB_00750596;
        y = pDVar8->ref;
        uVar10 = y;
        do {
          uVar6 = uVar10;
          uVar10 = table->subtables[(int)uVar6].next;
        } while (uVar6 < uVar10);
      }
      pDVar7 = pDVar8;
      if (DVar9 - uVar11 != uVar6 - y) {
        while (moves != (DdNode *)0x0) {
          pDVar8 = (moves->type).kids.T;
          moves->ref = 0;
          moves->next = table->nextFree;
          table->nextFree = moves;
          moves = pDVar8;
        }
        goto LAB_007504d2;
      }
      goto LAB_00750510;
    }
    pDVar7 = (DdNode *)ddSymmSiftingDown(table,uVar11,xHigh);
    if (pDVar7 == (DdNode *)0x1) {
      return 0;
    }
    if (pDVar7 == (DdNode *)0x0) {
      do {
        uVar10 = uVar11;
        uVar11 = table->subtables[(int)uVar10].next;
      } while (uVar10 < uVar11);
    }
    else {
      uVar11 = pDVar7->ref;
      uVar6 = uVar11;
      do {
        uVar10 = uVar6;
        uVar6 = table->subtables[(int)uVar10].next;
      } while (uVar10 < uVar6);
    }
    pDVar8 = (DdNode *)ddSymmSiftingUp(table,uVar11,xLow);
    if (pDVar8 != (DdNode *)0x1) {
      iVar5 = uVar10 - uVar11;
      if (pDVar8 == (DdNode *)0x0) {
        uVar6 = uVar11;
        do {
          DVar9 = uVar6;
          uVar6 = table->subtables[(int)DVar9].next;
        } while (DVar9 < uVar6);
      }
      else {
        DVar9 = pDVar8->index;
        uVar11 = table->subtables[(int)DVar9].next;
      }
      moves = pDVar8;
      if (iVar5 != DVar9 - uVar11) {
        while (pDVar7 != (DdNode *)0x0) {
          pDVar8 = (pDVar7->type).kids.T;
          pDVar7->ref = 0;
          pDVar7->next = table->nextFree;
          table->nextFree = pDVar7;
          pDVar7 = pDVar8;
        }
        iVar3 = table->keys - table->isolated;
        goto LAB_007504fd;
      }
      goto LAB_00750510;
    }
    moves = (DdNode *)0x1;
  }
  if ((DdNode *)0x1 < pDVar7) {
    pDVar8 = table->nextFree;
    do {
      pDVar12 = pDVar7;
      pDVar7 = (pDVar12->type).kids.T;
      pDVar12->ref = 0;
      pDVar12->next = pDVar8;
      pDVar8 = pDVar12;
    } while (pDVar7 != (DdNode *)0x0);
    table->nextFree = pDVar12;
  }
LAB_00750596:
  if ((DdNode *)0x1 < moves) {
    pDVar7 = table->nextFree;
    do {
      pDVar8 = moves;
      moves = (pDVar8->type).kids.T;
      pDVar8->ref = 0;
      pDVar8->next = pDVar7;
      pDVar7 = pDVar8;
    } while (moves != (DdNode *)0x0);
    table->nextFree = pDVar8;
  }
  return 0;
}

Assistant:

static int
ddSymmSiftingAux(
  DdManager * table,
  int  x,
  int  xLow,
  int  xHigh)
{
    Move *move;
    Move *moveUp;       /* list of up moves */
    Move *moveDown;     /* list of down moves */
    int  initialSize;
    int  result;
    int  i;
    int  topbot;        /* index to either top or bottom of symmetry group */
    int  initGroupSize, finalGroupSize;


#ifdef DD_DEBUG
    /* check for previously detected symmetry */
    assert(table->subtables[x].next == (unsigned) x);
#endif

    initialSize = table->keys - table->isolated;

    moveDown = NULL;
    moveUp = NULL;

    if ((x - xLow) > (xHigh - x)) {
        /* Will go down first, unless x == xHigh:
        ** Look for consecutive symmetries above x.
        */
        for (i = x; i > xLow; i--) {
            if (!cuddSymmCheck(table,i-1,i))
                break;
            topbot = table->subtables[i-1].next; /* find top of i-1's group */
            table->subtables[i-1].next = i;
            table->subtables[x].next = topbot; /* x is bottom of group so its */
                                               /* next is top of i-1's group */
            i = topbot + 1; /* add 1 for i--; new i is top of symm group */
        }
    } else {
        /* Will go up first unless x == xlow:
        ** Look for consecutive symmetries below x.
        */
        for (i = x; i < xHigh; i++) {
            if (!cuddSymmCheck(table,i,i+1))
                break;
            /* find bottom of i+1's symm group */
            topbot = i + 1;
            while ((unsigned) topbot < table->subtables[topbot].next) {
                topbot = table->subtables[topbot].next;
            }
            table->subtables[topbot].next = table->subtables[i].next;
            table->subtables[i].next = i + 1;
            i = topbot - 1; /* subtract 1 for i++; new i is bottom of group */
        }
    }

    /* Now x may be in the middle of a symmetry group.
    ** Find bottom of x's symm group.
    */
    while ((unsigned) x < table->subtables[x].next)
        x = table->subtables[x].next;

    if (x == xLow) { /* Sift down */

#ifdef DD_DEBUG
        /* x must be a singleton */
        assert((unsigned) x == table->subtables[x].next);
#endif
        if (x == xHigh) return(1);      /* just one variable */

        initGroupSize = 1;

        moveDown = ddSymmSiftingDown(table,x,xHigh);
            /* after this point x --> xHigh, unless early term */
        if (moveDown == MV_OOM) goto ddSymmSiftingAuxOutOfMem;
        if (moveDown == NULL) return(1);

        x = moveDown->y;
        /* Find bottom of x's group */
        i = x;
        while ((unsigned) i < table->subtables[i].next) {
            i = table->subtables[i].next;
        }
#ifdef DD_DEBUG
        /* x should be the top of the symmetry group and i the bottom */
        assert((unsigned) i >= table->subtables[i].next);
        assert((unsigned) x == table->subtables[i].next);
#endif
        finalGroupSize = i - x + 1;

        if (initGroupSize == finalGroupSize) {
            /* No new symmetry groups detected, return to best position */
            result = ddSymmSiftingBackward(table,moveDown,initialSize);
        } else {
            initialSize = table->keys - table->isolated;
            moveUp = ddSymmSiftingUp(table,x,xLow);
            result = ddSymmSiftingBackward(table,moveUp,initialSize);
        }
        if (!result) goto ddSymmSiftingAuxOutOfMem;

    } else if (cuddNextHigh(table,x) > xHigh) { /* Sift up */
        /* Find top of x's symm group */
        i = x;                          /* bottom */
        x = table->subtables[x].next;   /* top */

        if (x == xLow) return(1); /* just one big group */

        initGroupSize = i - x + 1;

        moveUp = ddSymmSiftingUp(table,x,xLow);
            /* after this point x --> xLow, unless early term */
        if (moveUp == MV_OOM) goto ddSymmSiftingAuxOutOfMem;
        if (moveUp == NULL) return(1);

        x = moveUp->x;
        /* Find top of x's group */
        i = table->subtables[x].next;
#ifdef DD_DEBUG
        /* x should be the bottom of the symmetry group and i the top */
        assert((unsigned) x >= table->subtables[x].next);
        assert((unsigned) i == table->subtables[x].next);
#endif
        finalGroupSize = x - i + 1;

        if (initGroupSize == finalGroupSize) {
            /* No new symmetry groups detected, return to best position */
            result = ddSymmSiftingBackward(table,moveUp,initialSize);
        } else {
            initialSize = table->keys - table->isolated;
            moveDown = ddSymmSiftingDown(table,x,xHigh);
            result = ddSymmSiftingBackward(table,moveDown,initialSize);
        }
        if (!result) goto ddSymmSiftingAuxOutOfMem;

    } else if ((x - xLow) > (xHigh - x)) { /* must go down first: shorter */

        moveDown = ddSymmSiftingDown(table,x,xHigh);
        /* at this point x == xHigh, unless early term */
        if (moveDown == MV_OOM) goto ddSymmSiftingAuxOutOfMem;

        if (moveDown != NULL) {
            x = moveDown->y;    /* x is top here */
            i = x;
            while ((unsigned) i < table->subtables[i].next) {
                i = table->subtables[i].next;
            }
        } else {
            i = x;
            while ((unsigned) i < table->subtables[i].next) {
                i = table->subtables[i].next;
            }
            x = table->subtables[i].next;
        }
#ifdef DD_DEBUG
        /* x should be the top of the symmetry group and i the bottom */
        assert((unsigned) i >= table->subtables[i].next);
        assert((unsigned) x == table->subtables[i].next);
#endif
        initGroupSize = i - x + 1;

        moveUp = ddSymmSiftingUp(table,x,xLow);
        if (moveUp == MV_OOM) goto ddSymmSiftingAuxOutOfMem;

        if (moveUp != NULL) {
            x = moveUp->x;
            i = table->subtables[x].next;
        } else {
            i = x;
            while ((unsigned) x < table->subtables[x].next)
                x = table->subtables[x].next;
        }
#ifdef DD_DEBUG
        /* x should be the bottom of the symmetry group and i the top */
        assert((unsigned) x >= table->subtables[x].next);
        assert((unsigned) i == table->subtables[x].next);
#endif
        finalGroupSize = x - i + 1;

        if (initGroupSize == finalGroupSize) {
            /* No new symmetry groups detected, return to best position */
            result = ddSymmSiftingBackward(table,moveUp,initialSize);
        } else {
            while (moveDown != NULL) {
                move = moveDown->next;
                cuddDeallocMove(table, moveDown);
                moveDown = move;
            }
            initialSize = table->keys - table->isolated;
            moveDown = ddSymmSiftingDown(table,x,xHigh);
            result = ddSymmSiftingBackward(table,moveDown,initialSize);
        }
        if (!result) goto ddSymmSiftingAuxOutOfMem;

    } else { /* moving up first: shorter */
        /* Find top of x's symmetry group */
        x = table->subtables[x].next;

        moveUp = ddSymmSiftingUp(table,x,xLow);
        /* at this point x == xHigh, unless early term */
        if (moveUp == MV_OOM) goto ddSymmSiftingAuxOutOfMem;

        if (moveUp != NULL) {
            x = moveUp->x;
            i = table->subtables[x].next;
        } else {
            while ((unsigned) x < table->subtables[x].next)
                x = table->subtables[x].next;
            i = table->subtables[x].next;
        }
#ifdef DD_DEBUG
        /* x is bottom of the symmetry group and i is top */
        assert((unsigned) x >= table->subtables[x].next);
        assert((unsigned) i == table->subtables[x].next);
#endif
        initGroupSize = x - i + 1;

        moveDown = ddSymmSiftingDown(table,x,xHigh);
        if (moveDown == MV_OOM) goto ddSymmSiftingAuxOutOfMem;

        if (moveDown != NULL) {
            x = moveDown->y;
            i = x;
            while ((unsigned) i < table->subtables[i].next) {
                i = table->subtables[i].next;
            }
        } else {
            i = x;
            x = table->subtables[x].next;
        }
#ifdef DD_DEBUG
        /* x should be the top of the symmetry group and i the bottom */
        assert((unsigned) i >= table->subtables[i].next);
        assert((unsigned) x == table->subtables[i].next);
#endif
        finalGroupSize = i - x + 1;

        if (initGroupSize == finalGroupSize) {
            /* No new symmetries detected, go back to best position */
            result = ddSymmSiftingBackward(table,moveDown,initialSize);
        } else {
            while (moveUp != NULL) {
                move = moveUp->next;
                cuddDeallocMove(table, moveUp);
                moveUp = move;
            }
            initialSize = table->keys - table->isolated;
            moveUp = ddSymmSiftingUp(table,x,xLow);
            result = ddSymmSiftingBackward(table,moveUp,initialSize);
        }
        if (!result) goto ddSymmSiftingAuxOutOfMem;
    }

    while (moveDown != NULL) {
        move = moveDown->next;
        cuddDeallocMove(table, moveDown);
        moveDown = move;
    }
    while (moveUp != NULL) {
        move = moveUp->next;
        cuddDeallocMove(table, moveUp);
        moveUp = move;
    }

    return(1);

ddSymmSiftingAuxOutOfMem:
    if (moveDown != MV_OOM) {
        while (moveDown != NULL) {
            move = moveDown->next;
            cuddDeallocMove(table, moveDown);
            moveDown = move;
        }
    }
    if (moveUp != MV_OOM) {
        while (moveUp != NULL) {
            move = moveUp->next;
            cuddDeallocMove(table, moveUp);
            moveUp = move;
        }
    }

    return(0);

}